

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O2

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)1>::butterfly_radix8<32l>
          (fft<float,2048l,(re::fft::direction)1> *this,span<std::complex<float>,_32L> out)

{
  long lVar1;
  complex<float> *a;
  complex<float> *b;
  complex<float> *b_00;
  complex<float> *b_01;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  complex<float> *a_00;
  long lVar6;
  long lVar7;
  complex<float> *a_01;
  long lVar8;
  long lVar9;
  complex<float> *a_02;
  complex<float> *b_02;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  lVar5 = 0x1c0;
  lVar6 = 0x300;
  lVar7 = 0x500;
  lVar8 = 0x200;
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 8) {
    lVar1 = (long)out.storage_.data_ + lVar9;
    b_02 = (complex<float> *)(lVar1 + 0x28);
    uVar2 = *(undefined8 *)(lVar1 + 0x48);
    uVar3 = *(undefined8 *)(lVar1 + 0x68);
    uVar4 = *(undefined8 *)(lVar1 + 0x88);
    fVar12 = (float)b_02->_M_value;
    fVar13 = (float)(b_02->_M_value >> 0x20);
    fVar10 = (float)*(undefined8 *)(this + lVar8 * 4);
    fVar11 = (float)((ulong)*(undefined8 *)(this + lVar8 * 4) >> 0x20);
    b_02->_M_value = CONCAT44(fVar12 * fVar11 + fVar10 * fVar13,fVar12 * fVar10 + fVar11 * -fVar13);
    fVar11 = (float)((ulong)uVar2 >> 0x20);
    fVar10 = (float)uVar2;
    fVar12 = (float)*(undefined8 *)(this + lVar8 * 2);
    fVar13 = (float)((ulong)*(undefined8 *)(this + lVar8 * 2) >> 0x20);
    *(ulong *)(lVar1 + 0x48) =
         CONCAT44(fVar10 * fVar13 + fVar12 * fVar11,fVar10 * fVar12 + fVar13 * -fVar11);
    fVar11 = (float)((ulong)uVar3 >> 0x20);
    fVar10 = (float)uVar3;
    fVar12 = (float)*(undefined8 *)(this + lVar6 * 4);
    fVar13 = (float)((ulong)*(undefined8 *)(this + lVar6 * 4) >> 0x20);
    *(ulong *)(lVar1 + 0x68) =
         CONCAT44(fVar10 * fVar13 + fVar12 * fVar11,fVar10 * fVar12 + fVar13 * -fVar11);
    fVar11 = (float)((ulong)uVar4 >> 0x20);
    fVar10 = (float)uVar4;
    fVar12 = (float)*(undefined8 *)(this + lVar8);
    fVar13 = (float)((ulong)*(undefined8 *)(this + lVar8) >> 0x20);
    *(ulong *)(lVar1 + 0x88) =
         CONCAT44(fVar10 * fVar13 + fVar12 * fVar11,fVar10 * fVar12 + fVar13 * -fVar11);
    fVar11 = (float)((ulong)*(undefined8 *)(lVar1 + 0xa8) >> 0x20);
    fVar10 = (float)*(undefined8 *)(lVar1 + 0xa8);
    fVar12 = (float)*(undefined8 *)(this + lVar7 * 2);
    fVar13 = (float)((ulong)*(undefined8 *)(this + lVar7 * 2) >> 0x20);
    *(ulong *)(lVar1 + 0xa8) =
         CONCAT44(fVar10 * fVar13 + fVar12 * fVar11,fVar10 * fVar12 + fVar13 * -fVar11);
    fVar11 = (float)((ulong)*(undefined8 *)(lVar1 + 200) >> 0x20);
    fVar10 = (float)*(undefined8 *)(lVar1 + 200);
    fVar12 = (float)*(undefined8 *)(this + lVar6 * 2);
    fVar13 = (float)((ulong)*(undefined8 *)(this + lVar6 * 2) >> 0x20);
    *(ulong *)(lVar1 + 200) =
         CONCAT44(fVar10 * fVar13 + fVar12 * fVar11,fVar10 * fVar12 + fVar13 * -fVar11);
    fVar11 = (float)((ulong)*(undefined8 *)(lVar1 + 0xe8) >> 0x20);
    fVar10 = (float)*(undefined8 *)(lVar1 + 0xe8);
    fVar12 = (float)*(undefined8 *)(this + lVar5 * 8);
    fVar13 = (float)((ulong)*(undefined8 *)(this + lVar5 * 8) >> 0x20);
    *(ulong *)(lVar1 + 0xe8) =
         CONCAT44(fVar10 * fVar13 + fVar12 * fVar11,fVar10 * fVar12 + fVar13 * -fVar11);
    a = (complex<float> *)((long)out.storage_.data_ + 8 + lVar9);
    scissors<float>(a,b_02);
    a_01 = (complex<float> *)((long)out.storage_.data_ + lVar9 + 0x48);
    b = (complex<float> *)((long)out.storage_.data_ + 0x68 + lVar9);
    scissors<float>(a_01,b);
    a_00 = (complex<float> *)((long)out.storage_.data_ + lVar9 + 0x88);
    b_00 = (complex<float> *)((long)out.storage_.data_ + 0xa8 + lVar9);
    scissors<float>(a_00,b_00);
    a_02 = (complex<float> *)((long)out.storage_.data_ + lVar9 + 200);
    b_01 = (complex<float> *)((long)out.storage_.data_ + 0xe8 + lVar9);
    scissors<float>(a_02,b_01);
    b->_M_value = CONCAT44((int)b->_M_value,(int)(b->_M_value >> 0x20)) ^ 0x80000000;
    fVar11 = (float)(b_00->_M_value >> 0x20);
    fVar10 = (float)b_00->_M_value;
    fVar12 = (float)*(undefined8 *)(this + 0x20);
    fVar13 = (float)((ulong)*(undefined8 *)(this + 0x20) >> 0x20);
    b_00->_M_value = CONCAT44(fVar10 * fVar13 + fVar12 * fVar11,fVar10 * fVar12 + fVar13 * -fVar11);
    fVar12 = (float)*(undefined8 *)(this + 0x20);
    fVar13 = (float)((ulong)*(undefined8 *)(this + 0x20) >> 0x20);
    fVar10 = (float)b_01->_M_value;
    fVar11 = (float)(b_01->_M_value >> 0x20);
    b_01->_M_value =
         CONCAT44(fVar10 * fVar12 - fVar13 * fVar11,fVar13 * fVar10 + fVar11 * fVar12) ^ 0x80000000;
    scissors<float>(a,a_01);
    scissors<float>(b_02,b);
    scissors<float>(a_00,a_02);
    scissors<float>(b_00,b_01);
    a_02->_M_value = CONCAT44((int)a_02->_M_value,(int)(a_02->_M_value >> 0x20)) ^ 0x80000000;
    b_01->_M_value = CONCAT44((int)b_01->_M_value,(int)(b_01->_M_value >> 0x20)) ^ 0x80000000;
    scissors<float>(a,a_00);
    scissors<float>(b_02,b_00);
    scissors<float>(a_01,a_02);
    scissors<float>(b,b_01);
    lVar5 = lVar5 + 0x1c0;
    lVar6 = lVar6 + 0x300;
    lVar7 = lVar7 + 0x500;
    lVar8 = lVar8 + 0x200;
  }
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }